

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

IfcVector3 * __thiscall
Assimp::IFC::TempMesh::Center(IfcVector3 *__return_storage_ptr__,TempMesh *this)

{
  aiVector3t<double> __init;
  size_type sVar1;
  undefined1 auVar2 [16];
  aiVector3t<double> local_50;
  __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_38;
  __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_30;
  aiVector3t<double> local_28;
  TempMesh *local_10;
  TempMesh *this_local;
  
  local_10 = this;
  sVar1 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size(&this->mVerts)
  ;
  if (sVar1 == 0) {
    aiVector3t<double>::aiVector3t(__return_storage_ptr__,0.0,0.0,0.0);
  }
  else {
    local_30._M_current =
         (aiVector3t<double> *)
         std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin(&this->mVerts)
    ;
    local_38._M_current =
         (aiVector3t<double> *)
         std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end(&this->mVerts);
    aiVector3t<double>::aiVector3t(&local_50);
    __init.y = local_50.y;
    __init.x = local_50.x;
    __init.z = local_50.z;
    std::
    accumulate<__gnu_cxx::__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,aiVector3t<double>>
              (&local_28,local_30,local_38,__init);
    sVar1 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      (&this->mVerts);
    auVar2._8_4_ = (int)(sVar1 >> 0x20);
    auVar2._0_8_ = sVar1;
    auVar2._12_4_ = 0x45300000;
    ::operator/(__return_storage_ptr__,&local_28,
                (auVar2._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  }
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 TempMesh::Center() const
{
    return (mVerts.size() == 0) ? IfcVector3(0.0f, 0.0f, 0.0f) : (std::accumulate(mVerts.begin(),mVerts.end(),IfcVector3()) / static_cast<IfcFloat>(mVerts.size()));
}